

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O3

REF_STATUS
ref_facelift_create(REF_FACELIFT *ref_facelift_ptr,REF_GRID freeable_ref_grid,REF_BOOL direct)

{
  size_t __size;
  REF_CELL pRVar1;
  uint uVar2;
  REF_STATUS RVar3;
  REF_FACELIFT pRVar4;
  REF_SEARCH *ppRVar5;
  long lVar6;
  REF_DBL *__s;
  REF_BOOL *__s_00;
  ulong uVar7;
  undefined8 uVar8;
  char *pcVar9;
  int iVar10;
  long lVar11;
  REF_CELL pRVar12;
  REF_INT nodes [27];
  REF_GEOM local_d8;
  double local_d0;
  REF_DBL local_c8 [4];
  REF_INT local_a8 [2];
  int local_a0;
  int local_9c;
  
  pRVar4 = (REF_FACELIFT)malloc(0x38);
  *ref_facelift_ptr = pRVar4;
  if (pRVar4 == (REF_FACELIFT)0x0) {
    pcVar9 = "malloc *ref_facelift_ptr of REF_FACELIFT_STRUCT NULL";
    uVar8 = 0x79;
    goto LAB_001b82d2;
  }
  pRVar4->grid = freeable_ref_grid;
  pRVar12 = freeable_ref_grid->cell[0];
  pRVar4->edg_cell = pRVar12;
  pRVar4->tri_cell = freeable_ref_grid->cell[3];
  pRVar1 = freeable_ref_grid->cell[1];
  if (0 < pRVar1->n) {
    pRVar4->edg_cell = pRVar1;
    pRVar12 = pRVar1;
  }
  pRVar1 = freeable_ref_grid->cell[2];
  if (0 < pRVar1->n) {
    pRVar4->edg_cell = pRVar1;
    pRVar12 = pRVar1;
  }
  if (0 < freeable_ref_grid->cell[4]->n) {
    pRVar4->tri_cell = freeable_ref_grid->cell[4];
  }
  if (0 < freeable_ref_grid->cell[5]->n) {
    pRVar4->tri_cell = freeable_ref_grid->cell[5];
  }
  if (direct == 0) {
    local_d8 = freeable_ref_grid->geom;
    iVar10 = local_d8->max;
    if ((long)iVar10 < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             0x9a,"ref_facelift_create","malloc ref_facelift->displacement of REF_DBL negative");
      return 1;
    }
    uVar2 = iVar10 * 3;
    __s = (REF_DBL *)malloc((ulong)uVar2 << 3);
    pRVar4->displacement = __s;
    if (__s == (REF_DBL *)0x0) {
      pcVar9 = "malloc ref_facelift->displacement of REF_DBL NULL";
      uVar8 = 0x9a;
LAB_001b82d2:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             uVar8,"ref_facelift_create",pcVar9);
      return 2;
    }
    if (iVar10 != 0) {
      uVar7 = 1;
      if (1 < (int)uVar2) {
        uVar7 = (ulong)uVar2;
      }
      memset(__s,0,uVar7 << 3);
    }
    __size = (long)iVar10 * 4;
    __s_00 = (REF_BOOL *)malloc(__size);
    pRVar4->strong_bc = __s_00;
    if (__s_00 == (REF_BOOL *)0x0) {
      pcVar9 = "malloc ref_facelift->strong_bc of REF_BOOL NULL";
      uVar8 = 0x9b;
      goto LAB_001b82d2;
    }
    if (iVar10 != 0) {
      memset(__s_00,0,__size);
    }
  }
  else {
    pRVar4->displacement = (REF_DBL *)0x0;
    pRVar4->strong_bc = (REF_BOOL *)0x0;
    local_d8 = freeable_ref_grid->geom;
  }
  pRVar4->edge_search = (REF_SEARCH *)0x0;
  lVar11 = (long)local_d8->nedge;
  if (lVar11 < 1) {
LAB_001b819d:
    pRVar4->face_search = (REF_SEARCH *)0x0;
    lVar11 = (long)local_d8->nface;
    if (lVar11 < 1) {
      return 0;
    }
    pRVar12 = pRVar4->tri_cell;
    ppRVar5 = (REF_SEARCH *)malloc(lVar11 * 8);
    pRVar4->face_search = ppRVar5;
    if (ppRVar5 != (REF_SEARCH *)0x0) {
      lVar6 = 0;
      do {
        pRVar4->face_search[lVar6] = (REF_SEARCH)0x0;
        lVar6 = lVar6 + 1;
      } while (lVar11 != lVar6);
      lVar6 = 0;
      do {
        uVar2 = ref_search_create((REF_SEARCH *)((long)pRVar4->face_search + lVar6),pRVar12->n);
        if (uVar2 != 0) {
          pcVar9 = "create face search";
          uVar8 = 0x60;
          goto LAB_001b8526;
        }
        lVar6 = lVar6 + 8;
      } while (lVar11 * 8 - lVar6 != 0);
      if (pRVar12->max < 1) {
        return 0;
      }
      iVar10 = 0;
LAB_001b8224:
      RVar3 = ref_cell_nodes(pRVar12,iVar10,local_a8);
      if (RVar3 != 0) {
LAB_001b829d:
        iVar10 = iVar10 + 1;
        if (pRVar12->max <= iVar10) {
          return 0;
        }
        goto LAB_001b8224;
      }
      local_9c = local_a8[pRVar12->node_per];
      uVar2 = ref_geom_tri_uv_bounding_sphere3(local_d8,local_a8,local_c8,&local_d0);
      if (uVar2 == 0) {
        local_c8[2] = 0.0;
        uVar2 = ref_search_insert(pRVar4->face_search[(long)local_9c + -1],iVar10,local_c8,
                                  local_d0 + local_d0);
        if (uVar2 != 0) {
          pcVar9 = "ins";
          uVar8 = 0x6c;
          goto LAB_001b8526;
        }
        goto LAB_001b829d;
      }
      pcVar9 = "bound with circle";
      uVar8 = 0x67;
LAB_001b8526:
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
             uVar8,"ref_facelift_cache_search",(ulong)uVar2,pcVar9);
      goto LAB_001b8530;
    }
    pcVar9 = "malloc ref_facelift->face_search of REF_SEARCH NULL";
    uVar8 = 0x5c;
  }
  else {
    ppRVar5 = (REF_SEARCH *)malloc(lVar11 * 8);
    pRVar4->edge_search = ppRVar5;
    if (ppRVar5 != (REF_SEARCH *)0x0) {
      lVar6 = 0;
      do {
        pRVar4->edge_search[lVar6] = (REF_SEARCH)0x0;
        lVar6 = lVar6 + 1;
      } while (lVar11 != lVar6);
      lVar6 = 0;
      do {
        uVar2 = ref_search_create((REF_SEARCH *)((long)pRVar4->edge_search + lVar6),pRVar12->n);
        if (uVar2 != 0) {
          pcVar9 = "create edge search";
          uVar8 = 0x44;
          goto LAB_001b8526;
        }
        lVar6 = lVar6 + 8;
      } while (lVar11 * 8 - lVar6 != 0);
      if (0 < pRVar12->max) {
        iVar10 = 0;
        do {
          RVar3 = ref_cell_nodes(pRVar12,iVar10,local_a8);
          if (RVar3 == 0) {
            local_a0 = local_a8[pRVar12->node_per];
            uVar2 = ref_geom_edg_t_bounding_sphere2(local_d8,local_a8,local_c8,&local_d0);
            if (uVar2 != 0) {
              pcVar9 = "bound with circle";
              uVar8 = 0x4b;
              goto LAB_001b8526;
            }
            local_c8[1] = 0.0;
            local_c8[2] = 0.0;
            uVar2 = ref_search_insert(pRVar4->edge_search[(long)local_a0 + -1],iVar10,local_c8,
                                      local_d0 + local_d0);
            if (uVar2 != 0) {
              pcVar9 = "ins";
              uVar8 = 0x51;
              goto LAB_001b8526;
            }
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 < pRVar12->max);
      }
      goto LAB_001b819d;
    }
    pcVar9 = "malloc ref_facelift->edge_search of REF_SEARCH NULL";
    uVar8 = 0x40;
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",uVar8,
         "ref_facelift_cache_search",pcVar9);
  uVar2 = 2;
LAB_001b8530:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",0x9e,
         "ref_facelift_create",(ulong)uVar2,"cache tri uv");
  return uVar2;
}

Assistant:

REF_FCN REF_STATUS ref_facelift_create(REF_FACELIFT *ref_facelift_ptr,
                                       REF_GRID freeable_ref_grid,
                                       REF_BOOL direct) {
  REF_FACELIFT ref_facelift;
  REF_INT n;

  ref_malloc(*ref_facelift_ptr, 1, REF_FACELIFT_STRUCT);

  ref_facelift = *ref_facelift_ptr;

  ref_facelift_grid(ref_facelift) = freeable_ref_grid;

  ref_facelift_edg(ref_facelift) =
      ref_grid_edg(ref_facelift_grid(ref_facelift));
  ref_facelift_tri(ref_facelift) =
      ref_grid_tri(ref_facelift_grid(ref_facelift));

  if (ref_cell_n(ref_grid_ed2(ref_facelift_grid(ref_facelift))) > 0) {
    ref_facelift_edg(ref_facelift) =
        ref_grid_ed2(ref_facelift_grid(ref_facelift));
  }
  if (ref_cell_n(ref_grid_ed3(ref_facelift_grid(ref_facelift))) > 0) {
    ref_facelift_edg(ref_facelift) =
        ref_grid_ed3(ref_facelift_grid(ref_facelift));
  }
  if (ref_cell_n(ref_grid_tr2(ref_facelift_grid(ref_facelift))) > 0) {
    ref_facelift_tri(ref_facelift) =
        ref_grid_tr2(ref_facelift_grid(ref_facelift));
  }
  if (ref_cell_n(ref_grid_tr3(ref_facelift_grid(ref_facelift))) > 0) {
    ref_facelift_tri(ref_facelift) =
        ref_grid_tr3(ref_facelift_grid(ref_facelift));
  }

  if (direct) {
    ref_facelift->displacement = NULL;
    ref_facelift->strong_bc = NULL;
  } else {
    n = ref_geom_max(ref_facelift_geom(ref_facelift));
    ref_malloc_init(ref_facelift->displacement, 3 * n, REF_DBL, 0.0);
    ref_malloc_init(ref_facelift->strong_bc, n, REF_BOOL, REF_FALSE);
  }

  RSS(ref_facelift_cache_search(ref_facelift), "cache tri uv");

  return REF_SUCCESS;
}